

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O2

void __thiscall cmCTestLaunch::WriteXMLAction(cmCTestLaunch *this,cmXMLElement *e2)

{
  bool bVar1;
  string *psVar2;
  cmXMLElement e3;
  string source;
  allocator<char> local_59;
  cmXMLElement local_58;
  string local_50;
  string local_30;
  
  cmXMLElement::Comment(e2,"Meta-information about the build action");
  cmXMLElement::cmXMLElement(&local_58,e2,"Action");
  if ((this->OptionTargetName)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"TargetName",(allocator<char> *)&local_30);
    cmXMLWriter::Element<std::__cxx11::string>(local_58.xmlwr,&local_50,&this->OptionTargetName);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((this->OptionLanguage)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Language",(allocator<char> *)&local_30);
    cmXMLWriter::Element<std::__cxx11::string>(local_58.xmlwr,&local_50,&this->OptionLanguage);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((this->OptionSource)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_50,(string *)&this->OptionSource);
    cmsys::SystemTools::ConvertToUnixSlashes(&local_50);
    psVar2 = &this->SourceDir;
    bVar1 = cmsys::SystemTools::FileIsFullPath(psVar2);
    if (bVar1) {
      bVar1 = cmsys::SystemTools::FileIsFullPath(&local_50);
      if (bVar1) {
        bVar1 = cmsys::SystemTools::IsSubDirectory(&local_50,psVar2);
        if (bVar1) {
          cmSystemTools::RelativePath(&local_30,psVar2,&local_50);
          std::__cxx11::string::operator=((string *)&local_50,(string *)&local_30);
          std::__cxx11::string::~string((string *)&local_30);
        }
      }
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"SourceFile",&local_59);
    cmXMLWriter::Element<std::__cxx11::string>(local_58.xmlwr,&local_30,&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((this->OptionOutput)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"OutputFile",(allocator<char> *)&local_30);
    cmXMLWriter::Element<std::__cxx11::string>(local_58.xmlwr,&local_50,&this->OptionOutput);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((this->OptionTargetType)._M_string_length == 0) {
    if ((this->OptionSource)._M_string_length == 0) goto LAB_00173e9b;
    local_30._M_dataplus._M_p = "object file";
  }
  else {
    psVar2 = &this->OptionTargetType;
    bVar1 = std::operator==(psVar2,"EXECUTABLE");
    if (bVar1) {
      local_30._M_dataplus._M_p = "executable";
    }
    else {
      bVar1 = std::operator==(psVar2,"SHARED_LIBRARY");
      if (bVar1) {
        local_30._M_dataplus._M_p = "shared library";
      }
      else {
        bVar1 = std::operator==(psVar2,"MODULE_LIBRARY");
        if (bVar1) {
          local_30._M_dataplus._M_p = "module library";
        }
        else {
          bVar1 = std::operator==(psVar2,"STATIC_LIBRARY");
          if (!bVar1) goto LAB_00173e9b;
          local_30._M_dataplus._M_p = "static library";
        }
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"OutputType",&local_59);
  cmXMLWriter::Element<char_const*>(local_58.xmlwr,&local_50,(char **)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
LAB_00173e9b:
  cmXMLElement::~cmXMLElement(&local_58);
  return;
}

Assistant:

void cmCTestLaunch::WriteXMLAction(cmXMLElement& e2)
{
  e2.Comment("Meta-information about the build action");
  cmXMLElement e3(e2, "Action");

  // TargetName
  if (!this->OptionTargetName.empty()) {
    e3.Element("TargetName", this->OptionTargetName);
  }

  // Language
  if (!this->OptionLanguage.empty()) {
    e3.Element("Language", this->OptionLanguage);
  }

  // SourceFile
  if (!this->OptionSource.empty()) {
    std::string source = this->OptionSource;
    cmSystemTools::ConvertToUnixSlashes(source);

    // If file is in source tree use its relative location.
    if (cmSystemTools::FileIsFullPath(this->SourceDir) &&
        cmSystemTools::FileIsFullPath(source) &&
        cmSystemTools::IsSubDirectory(source, this->SourceDir)) {
      source = cmSystemTools::RelativePath(this->SourceDir, source);
    }

    e3.Element("SourceFile", source);
  }

  // OutputFile
  if (!this->OptionOutput.empty()) {
    e3.Element("OutputFile", this->OptionOutput);
  }

  // OutputType
  const char* outputType = nullptr;
  if (!this->OptionTargetType.empty()) {
    if (this->OptionTargetType == "EXECUTABLE") {
      outputType = "executable";
    } else if (this->OptionTargetType == "SHARED_LIBRARY") {
      outputType = "shared library";
    } else if (this->OptionTargetType == "MODULE_LIBRARY") {
      outputType = "module library";
    } else if (this->OptionTargetType == "STATIC_LIBRARY") {
      outputType = "static library";
    }
  } else if (!this->OptionSource.empty()) {
    outputType = "object file";
  }
  if (outputType) {
    e3.Element("OutputType", outputType);
  }
}